

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_std_array.cpp
# Opt level: O0

int main(void)

{
  string *psVar1;
  iterator pvVar2;
  ostream *poVar3;
  iterator __last;
  value_type *word_1;
  iterator __end1_1;
  iterator __begin1_1;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  *__range1_1;
  value_type *word;
  iterator __end1;
  iterator __begin1;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  *__range1;
  allocator<char> local_79;
  string *local_78;
  undefined1 local_70 [8];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  greetings;
  
  greetings._M_elems[2].field_2._12_4_ = 0;
  __range1._1_1_ = 1;
  local_78 = (string *)local_70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_70,"Hello",&local_79);
  psVar1 = (string *)(greetings._M_elems[0].field_2._M_local_buf + 8);
  local_78 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (psVar1,"Hi",(allocator<char> *)((long)&__range1 + 3));
  psVar1 = (string *)(greetings._M_elems[1].field_2._M_local_buf + 8);
  local_78 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (psVar1,"Aloha",(allocator<char> *)((long)&__range1 + 2));
  __range1._1_1_ = 0;
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 3));
  std::allocator<char>::~allocator(&local_79);
  __end1 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
           ::begin((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                    *)local_70);
  pvVar2 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
           ::end((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                  *)local_70);
  for (; __end1 != pvVar2; __end1 = __end1 + 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)__end1);
    std::operator<<(poVar3," ");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  pvVar2 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
           ::begin((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                    *)local_70);
  __last = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
           ::end((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                  *)local_70);
  std::sort<std::__cxx11::string*>(pvVar2,__last);
  __end1_1 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
             ::begin((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                      *)local_70);
  pvVar2 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
           ::end((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                  *)local_70);
  for (; __end1_1 != pvVar2; __end1_1 = __end1_1 + 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)__end1_1);
    std::operator<<(poVar3," ");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
  ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
          *)local_70);
  return greetings._M_elems[2].field_2._12_4_;
}

Assistant:

int main() {
  std::array<std::string, 3> greetings =
    { "Hello", "Hi", "Aloha" };
  for (auto const & word : greetings)
    std::cout << word << " ";
  std::cout << "\n";

  std::sort(greetings.begin(), greetings.end());
  for (auto const & word : greetings)
    std::cout << word << " ";
  std::cout << "\n";
}